

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetephem.cpp
# Opt level: O3

void PrintEphemeris(CEObservation *obs,double *duration,double *step_size)

{
  double dVar1;
  CEDate *pCVar2;
  long lVar3;
  CEObservation *pCVar4;
  long lVar5;
  undefined8 *puVar6;
  int iVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  double dVar11;
  CESkyCoord obs_coords;
  vector<double,_std::allocator<double>_> lat_dms;
  vector<double,_std::allocator<double>_> lon_dms;
  vector<double,_std::allocator<double>_> localtime;
  CESkyCoord appar_coords;
  double local_1f0 [2];
  double local_1e0;
  double local_1d8 [2];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [48];
  double *local_188;
  CEDate *local_180;
  undefined8 *local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  CEObservation *local_130;
  undefined8 local_128;
  double local_120;
  undefined8 local_118;
  undefined8 local_110;
  double local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  double local_e8;
  undefined8 local_e0;
  CESkyCoord local_d8 [8];
  CEAngle local_d0 [16];
  CEAngle local_c0 [24];
  double *local_a8;
  double *local_90;
  double *local_78 [3];
  CESkyCoord local_60 [8];
  CEAngle local_58 [16];
  CEAngle local_48 [24];
  
  pCVar2 = *(CEDate **)(obs + 0x10);
  local_188 = step_size;
  if (*(long *)(obs + 8) == 0) {
    lVar5 = 0;
  }
  else {
    lVar5 = __dynamic_cast(*(long *)(obs + 8),&CEBody::typeinfo,&CEPlanet::typeinfo,0);
  }
  lVar3 = *(long *)(obs + 0x18);
  local_178 = *(undefined8 **)(lVar3 + 0xa8);
  local_130 = obs;
  local_1c8[0] = (undefined1 *)(**(code **)(*(long *)pCVar2 + 0x48))(pCVar2,&local_178);
  CETime::TimeDbl2Vect((double *)local_78);
  local_178 = *(undefined8 **)(lVar3 + 8);
  CEAngle::CEAngle((CEAngle *)local_1c8,(double *)&local_178);
  CEAngle::DmsVect();
  CEAngle::~CEAngle((CEAngle *)local_1c8);
  local_178 = *(undefined8 **)(lVar3 + 0x10);
  CEAngle::CEAngle((CEAngle *)local_1c8,(double *)&local_178);
  CEAngle::DmsVect();
  CEAngle::~CEAngle((CEAngle *)local_1c8);
  putchar(10);
  puts("= OBSERVER ===================");
  printf("  Longitude: %+4dd %02dm %4.1fs\n",local_90[2] + local_90[3],(ulong)(uint)(int)*local_90,
         (ulong)(uint)(int)local_90[1]);
  printf("  Latitude :  %+3dd %02dm %4.1fs\n",local_a8[2] + local_a8[3],(ulong)(uint)(int)*local_a8,
         (ulong)(uint)(int)local_a8[1]);
  printf("  Elevation: %f m \n",*(undefined8 *)(lVar3 + 0x18));
  printf("  Pressure : %f hPa\n",*(undefined8 *)(lVar3 + 0x20));
  printf("  Temp     : %f Celsius\n",*(undefined8 *)(lVar3 + 0x28));
  printf("  Humidity : %f %%\n",*(double *)(lVar3 + 0x30) * 100.0);
  printf("  Wavelen. : %f micrometers\n",*(undefined8 *)(lVar3 + 0x38));
  printf("  LocalTime: %02d:%02d:%04.1f\n",local_78[0][2] + local_78[0][3],
         (ulong)(uint)(int)*local_78[0],(ulong)(uint)(int)local_78[0][1]);
  printf("  UTCOffset: %2d hrs\n\n",(ulong)(uint)(int)*(double *)(lVar3 + 0xa8));
  puts("= PLANET =====================");
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,*(long *)(lVar5 + 0x30),
             *(long *)(lVar5 + 0x38) + *(long *)(lVar5 + 0x30));
  printf("  Name  : %s\n",local_1c8[0]);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0]);
  }
  printf("  Mass  : %e kg\n",*(undefined8 *)(lVar5 + 0x58));
  printf("  Radius: %f km\n",*(double *)(lVar5 + 0x50) / 1000.0);
  printf("  Albedo: %f\n\n",*(undefined8 *)(lVar5 + 0x60));
  puts("= NOTES ======================");
  puts("  * RA,DEC represent apparent ICRS coordinates for the observer");
  puts("  * Coordinates should be considered dubious at small altitudes");
  putchar(10);
  puts("      JD        LOCAL     RA (appar.)    DEC (appar.)     Az       Alt  ");
  puts(" =======================================================================");
  dVar11 = *duration;
  dVar1 = *local_188;
  CESkyCoord::CESkyCoord(local_d8);
  CESkyCoord::CESkyCoord(local_60);
  if ((int)(dVar11 / dVar1) < 0) {
    puVar6 = (undefined8 *)0x0;
    puVar10 = (undefined8 *)0x0;
  }
  else {
    iVar7 = (int)(dVar11 / dVar1) + 1;
    puVar8 = (undefined8 *)0x0;
    puVar9 = (undefined8 *)0x0;
    local_180 = pCVar2;
    do {
      pCVar4 = local_130;
      local_1d8[0] = (double)(**(code **)(*(long *)local_130 + 0x28))(local_130);
      CEAngle::CEAngle((CEAngle *)local_1c8,local_1d8);
      local_1f0[0] = (double)(**(code **)(*(long *)pCVar4 + 0x38))(pCVar4);
      CEAngle::CEAngle((CEAngle *)&local_178,local_1f0);
      local_1e0 = (double)CONCAT44(local_1e0._4_4_,3);
      CESkyCoord::SetCoordinates
                ((CEAngle *)local_d8,(CEAngle *)local_1c8,(CESkyCoordType *)&local_178);
      CEAngle::~CEAngle((CEAngle *)&local_178);
      CEAngle::~CEAngle((CEAngle *)local_1c8);
      CESkyCoord::ConvertToICRS((CEDate *)local_1c8,(CEObserver *)local_d8);
      CESkyCoord::operator=(local_60,(CESkyCoord *)local_1c8);
      CESkyCoord::~CESkyCoord((CESkyCoord *)local_1c8);
      CEDate::CEDate((CEDate *)local_1c8,2451545.0,JD);
      local_1f0[0] = CEAngle::operator_cast_to_double(local_58);
      CEAngle::CEAngle((CEAngle *)local_1d8,local_1f0);
      CEAngle::HmsVect();
      puVar6 = local_178;
      local_178 = (undefined8 *)0x0;
      uStack_170 = 0;
      local_168 = 0;
      if ((puVar9 != (undefined8 *)0x0) && (operator_delete(puVar9), local_178 != (undefined8 *)0x0)
         ) {
        operator_delete(local_178);
      }
      CEAngle::~CEAngle((CEAngle *)local_1d8);
      CEDate::~CEDate((CEDate *)local_1c8);
      CEDate::CEDate((CEDate *)local_1c8,2451545.0,JD);
      local_1f0[0] = CEAngle::operator_cast_to_double(local_48);
      CEAngle::CEAngle((CEAngle *)local_1d8,local_1f0);
      CEAngle::DmsVect();
      puVar10 = local_178;
      local_178 = (undefined8 *)0x0;
      uStack_170 = 0;
      local_168 = 0;
      if ((puVar8 != (undefined8 *)0x0) && (operator_delete(puVar8), local_178 != (undefined8 *)0x0)
         ) {
        operator_delete(local_178);
      }
      CEAngle::~CEAngle((CEAngle *)local_1d8);
      CEDate::~CEDate((CEDate *)local_1c8);
      pCVar2 = local_180;
      local_e8 = CEDate::operator_cast_to_double(local_180);
      local_e0 = *(undefined8 *)(lVar3 + 0xa8);
      local_f0 = (**(code **)(*(long *)pCVar2 + 0x48))(pCVar2);
      local_f8 = *puVar6;
      local_100 = puVar6[1];
      local_108 = (double)puVar6[2] + (double)puVar6[3];
      local_110 = *puVar10;
      local_118 = puVar10[1];
      local_120 = (double)puVar10[2] + (double)puVar10[3];
      CEDate::CEDate((CEDate *)local_1c8,2451545.0,JD);
      local_178 = (undefined8 *)CEAngle::operator_cast_to_double(local_d0);
      CEAngle::CEAngle((CEAngle *)local_1d8,(double *)&local_178);
      local_128 = CEAngle::Deg();
      CEDate::CEDate((CEDate *)&local_178,2451545.0,JD);
      local_1e0 = CEAngle::operator_cast_to_double(local_c0);
      CEAngle::CEAngle((CEAngle *)local_1f0,&local_1e0);
      CEAngle::Deg();
      printf(" %11.2f  %08.1f  %2.0fh %2.0fm %4.1fs  %+3.0fd %2.0fm %4.1fs  %8.3f  %+7.3f\n",
             local_e8,local_f0,local_f8,local_100,local_108,local_110,local_118,local_120);
      CEAngle::~CEAngle((CEAngle *)local_1f0);
      CEDate::~CEDate((CEDate *)&local_178);
      CEAngle::~CEAngle((CEAngle *)local_1d8);
      CEDate::~CEDate((CEDate *)local_1c8);
      dVar11 = (double)(**(code **)(*(long *)pCVar2 + 0x20))(pCVar2);
      local_1c8[0] = (undefined1 *)(dVar11 + *local_188 / 1440.0);
      local_178 = (undefined8 *)((ulong)local_178 & 0xffffffff00000000);
      (**(code **)(*(long *)pCVar2 + 0x10))(pCVar2,(CEDate *)local_1c8,(CEDate *)&local_178);
      iVar7 = iVar7 + -1;
      puVar8 = puVar10;
      puVar9 = puVar6;
    } while (iVar7 != 0);
  }
  puts(" -------------------------------------------------------------------");
  CESkyCoord::~CESkyCoord(local_60);
  CESkyCoord::~CESkyCoord(local_d8);
  if (puVar10 != (undefined8 *)0x0) {
    operator_delete(puVar10);
  }
  if (puVar6 != (undefined8 *)0x0) {
    operator_delete(puVar6);
  }
  if (local_a8 != (double *)0x0) {
    operator_delete(local_a8);
  }
  if (local_90 != (double *)0x0) {
    operator_delete(local_90);
  }
  if (local_78[0] != (double *)0x0) {
    operator_delete(local_78[0]);
  }
  return;
}

Assistant:

void PrintEphemeris(CEObservation& obs, 
                    const double&  duration, 
                    const double&  step_size)
{
    // Lets get the objects in obs
    CEDate* date = obs.Date();
    CEPlanet* planet = dynamic_cast<CEPlanet*>( obs.Body() );
    CEObserver* observer = obs.Observer();
    std::vector<double> localtime = CETime::TimeDbl2Vect(date->GetTime(observer->UTCOffset()));
    
    // Print some information about the observer
    std::vector<double> lon_dms = CEAngle(observer->Longitude_Rad()).DmsVect();
    std::vector<double> lat_dms = CEAngle(observer->Latitude_Rad()).DmsVect();

    std::printf("\n") ;
    std::printf("= OBSERVER ===================\n");
    std::printf("  Longitude: %+4dd %02dm %4.1fs\n", int(lon_dms[0]), int(lon_dms[1]), lon_dms[2]+lon_dms[3]);
    std::printf("  Latitude :  %+3dd %02dm %4.1fs\n", int(lat_dms[0]), int(lat_dms[1]), lat_dms[2]+lat_dms[3]);
    std::printf("  Elevation: %f m \n", observer->Elevation_m());
    std::printf("  Pressure : %f hPa\n", observer->Pressure_hPa());
    std::printf("  Temp     : %f Celsius\n", observer->Temperature_C());
    std::printf("  Humidity : %f %%\n", 100.0*observer->RelativeHumidity());
    std::printf("  Wavelen. : %f micrometers\n", observer->Wavelength_um());
    std::printf("  LocalTime: %02d:%02d:%04.1f\n", int(localtime[0]), int(localtime[1]), localtime[2]+localtime[3]);
    std::printf("  UTCOffset: %2d hrs\n\n", int(observer->UTCOffset()));

    // Print some basic information regarding the planet itself
    std::printf("= PLANET =====================\n");
    std::printf("  Name  : %s\n", planet->Name().c_str());
    std::printf("  Mass  : %e kg\n", planet->Mass_kg());
    std::printf("  Radius: %f km\n", planet->Radius_m()/1000.0);
    std::printf("  Albedo: %f\n\n", planet->Albedo());
    
    std::vector<double> ra;
    std::vector<double> dec;
    
    // Now do the stuff we actually want
    std::printf("= NOTES ======================\n");
    std::printf("  * RA,DEC represent apparent ICRS coordinates for the observer\n");
    std::printf("  * Coordinates should be considered dubious at small altitudes\n");
    std::printf("\n");
    std::printf("      JD        LOCAL     RA (appar.)    DEC (appar.)     Az       Alt  \n") ;
    std::printf(" =======================================================================\n") ;
    int max_steps = int(duration/step_size);
    CESkyCoord obs_coords;
    CESkyCoord appar_coords;
    for (int s=0; s<=max_steps; s++) {

        // Get the observed coordinates
        obs_coords.SetCoordinates(obs.GetAzimuth_Rad(), obs.GetZenith_Rad(),
                                  CESkyCoordType::OBSERVED);
        // Convert to RA,DEC
        appar_coords = obs_coords.ConvertToICRS(*date, *observer);
        // Update the coordiantes of the planet
        ra  = appar_coords.XCoord().HmsVect();
        dec = appar_coords.YCoord().DmsVect();
        
        std::printf(" %11.2f  %08.1f  %2.0fh %2.0fm %4.1fs  %+3.0fd %2.0fm %4.1fs  %8.3f  %+7.3f\n",
                    double(*date), date->GetTime(observer->UTCOffset()),
                    ra[0], ra[1], ra[2] + ra[3],
                    dec[0], dec[1], dec[2] + dec[3],
                    obs_coords.XCoord().Deg(),
                    90.0-obs_coords.YCoord().Deg());
        
        // Update the date
        date->SetDate(date->JD() + step_size/(60.0*24.0), CEDateType::JD);
    }
    
    std::printf(" -------------------------------------------------------------------\n");
}